

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::ComplexTypeInfo::addElement(ComplexTypeInfo *this,SchemaElementDecl *elem)

{
  ulong uVar1;
  SchemaElementDecl **ppSVar2;
  MemoryManager *pMVar3;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *this_00;
  XMLSize_t XVar4;
  ulong uVar5;
  int iVar6;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *pRVar7;
  undefined4 extraout_var;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  pRVar7 = this->fElements;
  if (pRVar7 == (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
    pRVar7 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)
             XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar3 = this->fMemoryManager;
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__BaseRefVectorOf_00416108;
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fAdoptedElems = false;
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount = 0;
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMaxCount = 8;
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
         (SchemaElementDecl **)0x0;
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMemoryManager = pMVar3;
    iVar6 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,0x40);
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
         (SchemaElementDecl **)CONCAT44(extraout_var,iVar6);
    lVar8 = 0;
    do {
      (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList[lVar8] =
           (SchemaElementDecl *)0x0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__RefVectorOf_00416090;
    this->fElements = pRVar7;
  }
  else {
    uVar1 = (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
    bVar10 = uVar1 != 0;
    if (bVar10) {
      ppSVar2 = (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList;
      if (*ppSVar2 == elem) {
        return;
      }
      uVar5 = 1;
      do {
        uVar9 = uVar5;
        if (uVar1 == uVar9) break;
        uVar5 = uVar9 + 1;
      } while (ppSVar2[uVar9] != elem);
      bVar10 = uVar9 < uVar1;
    }
    if (bVar10) {
      return;
    }
  }
  this_00 = &this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(this_00,1);
  XVar4 = this_00->fCurCount;
  this_00->fElemList[XVar4] = elem;
  this_00->fCurCount = XVar4 + 1;
  return;
}

Assistant:

inline void ComplexTypeInfo::addElement(SchemaElementDecl* const elem) {

    if (!fElements) {
        fElements = new (fMemoryManager) RefVectorOf<SchemaElementDecl>(8, false, fMemoryManager);
    }
    else if (fElements->containsElement(elem)) {
        return;
    }

    fElements->addElement(elem);
}